

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

double despot::POMCP::Simulate
                 (State *particle,RandomStreams *streams,VNode *vnode,DSPOMDP *model,
                 POMCPPrior *prior)

{
  POMCPPrior *pPVar1;
  RandomStreams *pRVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  void *this;
  QNode *this_00;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_01;
  mapped_type *ppVVar8;
  VNode *pVVar9;
  double dVar10;
  double dVar11;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *vnodes;
  QNode *qnode;
  key_type kStack_58;
  bool terminal;
  OBS_TYPE obs;
  double reward;
  double dStack_40;
  ACT_TYPE action;
  double explore_constant;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  VNode *vnode_local;
  RandomStreams *streams_local;
  State *particle_local;
  
  explore_constant = (double)prior;
  prior_local = (POMCPPrior *)model;
  model_local = (DSPOMDP *)vnode;
  vnode_local = (VNode *)streams;
  streams_local = (RandomStreams *)particle;
  bVar3 = RandomStreams::Exhausted(streams);
  if (bVar3) {
    particle_local = (State *)0x0;
  }
  else {
    dStack_40 = POMCPPrior::exploration_constant((POMCPPrior *)explore_constant);
    reward._4_4_ = UpperBoundAction((VNode *)model_local,dStack_40);
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
      plVar6 = logging::stream(4);
      poVar7 = despot::operator<<(&plVar6->super_ostream,(State *)streams_local);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = logging::level();
    if ((0 < iVar4) && (iVar4 = logging::level(), 3 < iVar4)) {
      plVar6 = logging::stream(4);
      poVar7 = std::operator<<(&plVar6->super_ostream,"depth = ");
      iVar4 = VNode::depth((VNode *)model_local);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
      poVar7 = std::operator<<(poVar7,"; action = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,reward._4_4_);
      poVar7 = std::operator<<(poVar7,"; ");
      this = (void *)std::ostream::operator<<
                               (poVar7,*(int *)&(streams_local->streams_).
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    pRVar2 = streams_local;
    pPVar1 = prior_local;
    RandomStreams::Entry
              ((RandomStreams *)vnode_local,
               *(int *)&(streams_local->streams_).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar5 = (*pPVar1->_vptr_POMCPPrior[2])
                      (pPVar1,pRVar2,(ulong)reward._4_4_,&obs,&stack0xffffffffffffffa8);
    this_00 = VNode::Child((VNode *)model_local,reward._4_4_);
    if ((uVar5 & 1) == 0) {
      (**(code **)(*(long *)explore_constant + 0x30))(explore_constant,reward._4_4_,kStack_58);
      RandomStreams::Advance((RandomStreams *)vnode_local);
      this_01 = QNode::children(this_00);
      ppVVar8 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](this_01,&stack0xffffffffffffffa8);
      if (*ppVVar8 == (mapped_type)0x0) {
        dVar10 = Globals::Discount();
        pRVar2 = streams_local;
        pVVar9 = vnode_local;
        iVar4 = VNode::depth((VNode *)model_local);
        dVar11 = Rollout((State *)pRVar2,(RandomStreams *)pVVar9,iVar4 + 1,(DSPOMDP *)prior_local,
                         (POMCPPrior *)explore_constant);
        obs = (OBS_TYPE)(dVar10 * dVar11 + (double)obs);
        iVar4 = VNode::depth((VNode *)model_local);
        pVVar9 = CreateVNode(iVar4 + 1,(State *)streams_local,(POMCPPrior *)explore_constant,
                             (DSPOMDP *)prior_local);
        ppVVar8 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_01,&stack0xffffffffffffffa8);
        *ppVVar8 = pVVar9;
      }
      else {
        dVar10 = Globals::Discount();
        pRVar2 = streams_local;
        pVVar9 = vnode_local;
        ppVVar8 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_01,&stack0xffffffffffffffa8);
        dVar11 = Simulate((State *)pRVar2,(RandomStreams *)pVVar9,*ppVVar8,(DSPOMDP *)prior_local,
                          (POMCPPrior *)explore_constant);
        obs = (OBS_TYPE)(dVar10 * dVar11 + (double)obs);
      }
      RandomStreams::Back((RandomStreams *)vnode_local);
      (**(code **)(*(long *)explore_constant + 0x38))();
    }
    QNode::Add(this_00,(double)obs);
    VNode::Add((VNode *)model_local,(double)obs);
    particle_local = (State *)obs;
  }
  return (double)particle_local;
}

Assistant:

double POMCP::Simulate(State* particle, RandomStreams& streams, VNode* vnode,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted())
		return 0;

	double explore_constant = prior->exploration_constant();

	ACT_TYPE action = POMCP::UpperBoundAction(vnode, explore_constant);
	logd << *particle << endl;
	logd << "depth = " << vnode->depth() << "; action = " << action << "; "
		<< particle->scenario_id << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);

	QNode* qnode = vnode->Child(action);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		if (vnodes[obs] != NULL) {
			reward += Globals::Discount()
				* Simulate(particle, streams, vnodes[obs], model, prior);
		} else { // Rollout upon encountering a node not in curren tree, then add the node
			reward += Globals::Discount() 
        * Rollout(particle, streams, vnode->depth() + 1, model, prior);
			vnodes[obs] = CreateVNode(vnode->depth() + 1, particle, prior,
				model);
		}
		streams.Back();
		prior->PopLast();
	}

	qnode->Add(reward);
	vnode->Add(reward);

	return reward;
}